

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::deflate_stream_test::testDeflate(deflate_stream_test *this,ICompressor *c)

{
  ICompressor *pIVar1;
  size_t n;
  size_t n_00;
  string local_e8;
  code *local_c8;
  undefined8 local_c0;
  string local_b8;
  code *local_98;
  undefined8 local_90;
  allocator<char> local_81;
  string local_80;
  code *local_60;
  undefined8 local_58;
  allocator<char> local_39;
  string local_38;
  ICompressor *local_18;
  ICompressor *c_local;
  deflate_stream_test *this_local;
  
  local_18 = c;
  c_local = (ICompressor *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hello, world!",&local_39);
  local_60 = doDeflate1_beast;
  local_58 = 0;
  doMatrix(this,c,&local_38,0x111f00);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pIVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Hello, world!",&local_81);
  local_98 = doDeflate2_beast;
  local_90 = 0;
  doMatrix(this,pIVar1,&local_80,0x1122f0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pIVar1 = local_18;
  corpus1_abi_cxx11_(&local_b8,(deflate_stream_test *)0x38,n);
  local_c8 = doDeflate2_beast;
  local_c0 = 0;
  doMatrix(this,pIVar1,&local_b8,0x1122f0);
  std::__cxx11::string::~string((string *)&local_b8);
  pIVar1 = local_18;
  corpus1_abi_cxx11_(&local_e8,(deflate_stream_test *)0x400,n_00);
  doMatrix(this,pIVar1,&local_e8,0x111f00);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void testDeflate(ICompressor& c)
    {
        doMatrix(c, "Hello, world!", &self::doDeflate1_beast);
        doMatrix(c, "Hello, world!", &self::doDeflate2_beast);
        doMatrix(c, corpus1(56), &self::doDeflate2_beast);
        doMatrix(c, corpus1(1024), &self::doDeflate1_beast);
    }